

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O3

int32_t __thiscall
icu_63::BMPSet::spanBackUTF8(BMPSet *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  uint c;
  int32_t iVar1;
  undefined8 in_RAX;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  undefined8 local_38;
  
  uVar6 = (uint)(spanCondition != USET_SPAN_NOT_CONTAINED);
  local_38 = in_RAX;
  do {
    lVar3 = (long)length;
    iVar8 = length + -1;
    local_38 = CONCAT44(local_38._4_4_,iVar8);
    lVar5 = (long)(char)s[lVar3 + -1];
    if (-1 < lVar5) {
      if (spanCondition == USET_SPAN_NOT_CONTAINED) {
        if (this->latin1Contains[lVar5] != '\0') {
          return length;
        }
        iVar8 = length + -2;
        while( true ) {
          if (lVar3 == 1) {
            return 0;
          }
          local_38 = CONCAT44(local_38._4_4_,iVar8);
          lVar5 = (long)(char)s[lVar3 + -2];
          if (lVar5 < 0) break;
          lVar3 = lVar3 + -1;
          iVar8 = iVar8 + -1;
          if (this->latin1Contains[lVar5] != '\0') goto LAB_002e52f2;
        }
      }
      else {
        if (this->latin1Contains[lVar5] == '\0') {
          return length;
        }
        lVar3 = (long)length;
        iVar8 = length + -2;
        while( true ) {
          if (lVar3 == 1) {
            return 0;
          }
          local_38 = CONCAT44(local_38._4_4_,iVar8);
          lVar5 = (long)(char)s[lVar3 + -2];
          if (lVar5 < 0) break;
          lVar3 = lVar3 + -1;
          iVar8 = iVar8 + -1;
          if (this->latin1Contains[lVar5] == '\0') {
LAB_002e52f2:
            return (int32_t)lVar3;
          }
        }
      }
    }
    c = utf8_prevCharSafeBody_63(s,0,(int32_t *)&local_38,(uint)lVar5 & 0xff,-3);
    if ((int)c < 0x800) {
      bVar7 = (byte)(this->table7FF[c & 0x3f] >> ((byte)(c >> 6) & 0x1f)) ^
              spanCondition != USET_SPAN_NOT_CONTAINED;
joined_r0x002e52e1:
      if ((bVar7 & 1) != 0) {
LAB_002e5303:
        return iVar8 + 1;
      }
    }
    else {
      if (0xffff < c) {
        local_38 = CONCAT44(uVar6,(int32_t)local_38);
        iVar1 = findCodePoint(this,c,this->list4kStarts[0x10],this->list4kStarts[0x11]);
        bVar7 = (byte)iVar1 ^ spanCondition != USET_SPAN_NOT_CONTAINED;
        uVar6 = local_38._4_4_;
        goto joined_r0x002e52e1;
      }
      uVar2 = c >> 0xc;
      uVar4 = *(uint *)((long)this->bmpBlockBits + (ulong)(c >> 4 & 0xfc)) >> ((byte)uVar2 & 0x1f) &
              0x10001;
      if (1 < uVar4) {
        iVar1 = findCodePoint(this,c,this->list4kStarts[uVar2],this->list4kStarts[(ulong)uVar2 + 1])
        ;
        bVar7 = (byte)iVar1 ^ spanCondition != USET_SPAN_NOT_CONTAINED;
        goto joined_r0x002e52e1;
      }
      if (uVar4 != uVar6) goto LAB_002e5303;
    }
    length = (int32_t)local_38;
    if ((int32_t)local_38 < 1) {
      return 0;
    }
  } while( true );
}

Assistant:

int32_t
BMPSet::spanBackUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    uint8_t b;

    do {
        b=s[--length];
        if(U8_IS_SINGLE(b)) {
            // ASCII sub-span
            if(spanCondition) {
                do {
                    if(!latin1Contains[b]) {
                        return length+1;
                    } else if(length==0) {
                        return 0;
                    }
                    b=s[--length];
                } while(U8_IS_SINGLE(b));
            } else {
                do {
                    if(latin1Contains[b]) {
                        return length+1;
                    } else if(length==0) {
                        return 0;
                    }
                    b=s[--length];
                } while(U8_IS_SINGLE(b));
            }
        }

        int32_t prev=length;
        UChar32 c;
        // trail byte: collect a multi-byte character
        // (or  lead byte in last-trail position)
        c=utf8_prevCharSafeBody(s, 0, &length, b, -3);
        // c is a valid code point, not ASCII, not a surrogate
        if(c<=0x7ff) {
            if((USetSpanCondition)((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) != spanCondition) {
                return prev+1;
            }
        } else if(c<=0xffff) {
            int lead=c>>12;
            uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
            if(twoBits<=1) {
                // All 64 code points with the same bits 15..6
                // are either in the set or not.
                if(twoBits!=(uint32_t)spanCondition) {
                    return prev+1;
                }
            } else {
                // Look up the code point in its 4k block of code points.
                if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1]) != spanCondition) {
                    return prev+1;
                }
            }
        } else {
            if(containsSlow(c, list4kStarts[0x10], list4kStarts[0x11]) != spanCondition) {
                return prev+1;
            }
        }
    } while(length>0);
    return 0;
}